

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment.h
# Opt level: O0

void __thiscall Comment::Comment(Comment *this,Comment *param_2)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RSI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40,in_RSI + 0x40);
  std::__cxx11::string::string(in_RDI + 0x60,in_RSI + 0x60);
  std::__cxx11::string::string(in_RDI + 0x80,in_RSI + 0x80);
  std::__cxx11::string::string(in_RDI + 0xa0,in_RSI + 0xa0);
  std::__cxx11::string::string(in_RDI + 0xc0,in_RSI + 0xc0);
  *(undefined8 *)(in_RDI + 0xe0) = *(undefined8 *)(in_RSI + 0xe0);
  in_RDI[0xe8] = in_RSI[0xe8];
  return;
}

Assistant:

Comment(const Json& json) {
			id = json["id"].get<std::string>();

			body = replaceHtmlSymbols(json["body"].get<std::string>());
			str::replace_all(body, "\\_", "_");

			author = json["author"].get<std::string>();

			created = json["created"].get<size_t>();

			fullName = json["name"].get<std::string>();

			link = "https://www.reddit.com" + json["permalink"].get<std::string>();

			const std::string parentId_entry = json["parent_id"].get<std::string>();
			parentId = parentId_entry.substr(3); // t1_[...], t3_[...]
			isTopLevelComment = str::starts_with(parentId_entry, "t3_");

			const std::string threadId_entry = json["link_id"].get<std::string>();
			threadId = threadId_entry.substr(3); // t3_[...]
		}